

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O0

int __thiscall DLevelScript::SideFromID(DLevelScript *this,int id,int side)

{
  int iVar1;
  int line;
  int side_local;
  int id_local;
  DLevelScript *this_local;
  
  if ((side == 0) || (side == 1)) {
    if (id == 0) {
      if (this->activationline == (line_t_conflict *)0x0) {
        this_local._4_4_ = -1;
      }
      else if (this->activationline->sidedef[side] == (side_t *)0x0) {
        this_local._4_4_ = -1;
      }
      else {
        this_local._4_4_ = this->activationline->sidedef[side]->Index;
      }
    }
    else {
      iVar1 = P_FindFirstLineFromID(id);
      if (iVar1 == -1) {
        this_local._4_4_ = -1;
      }
      else if (lines[iVar1].sidedef[side] == (side_t *)0x0) {
        this_local._4_4_ = -1;
      }
      else {
        this_local._4_4_ = lines[iVar1].sidedef[side]->Index;
      }
    }
  }
  else {
    this_local._4_4_ = -1;
  }
  return this_local._4_4_;
}

Assistant:

int DLevelScript::SideFromID(int id, int side)
{
	if (side != 0 && side != 1) return -1;
	
	if (id == 0)
	{
		if (activationline == NULL) return -1;
		if (activationline->sidedef[side] == NULL) return -1;
		return activationline->sidedef[side]->Index;
	}
	else
	{
		int line = P_FindFirstLineFromID(id);
		if (line == -1) return -1;
		if (lines[line].sidedef[side] == NULL) return -1;
		return lines[line].sidedef[side]->Index;
	}
}